

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_LSR_zzi(DisasContext_conflict1 *s,arg_rri_esz *a)

{
  int iVar1;
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  
  iVar1 = a->esz;
  if (-1 < iVar1) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      oprsz = s->sve_len;
      if (a->imm < 8 << ((byte)a->esz & 0x1f)) {
        tcg_gen_gvec_shri_aarch64
                  (tcg_ctx,a->esz,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,(long)a->imm,oprsz,
                   oprsz);
      }
      else {
        tcg_gen_gvec_dup64i_aarch64(s->uc->tcg_ctx,a->rd * 0x100 + 0xc10,oprsz,oprsz,0);
      }
    }
  }
  return -1 < iVar1;
}

Assistant:

static bool do_shift_imm(DisasContext *s, arg_rri_esz *a, bool asr,
                         void (*gvec_fn)(TCGContext *, unsigned, uint32_t, uint32_t,
                                         int64_t, uint32_t, uint32_t))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz < 0) {
        /* Invalid tsz encoding -- see tszimm_esz. */
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        /* Shift by element size is architecturally valid.  For
           arithmetic right-shift, it's the same as by one less.
           Otherwise it is a zeroing operation.  */
        if (a->imm >= 8 << a->esz) {
            if (asr) {
                a->imm = (8 << a->esz) - 1;
            } else {
                do_dupi_z(s, a->rd, 0);
                return true;
            }
        }
        gvec_fn(tcg_ctx, a->esz, vec_full_reg_offset(s, a->rd),
                vec_full_reg_offset(s, a->rn), a->imm, vsz, vsz);
    }
    return true;
}